

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_debug_helpers_generated.c
# Opt level: O0

char * mbedtls_ssl_named_group_to_str(uint16_t in)

{
  char *pcStack_10;
  uint16_t in_local;
  
  if (in == 0x12) {
    pcStack_10 = "secp192k1";
  }
  else if (in == 0x13) {
    pcStack_10 = "secp192r1";
  }
  else if (in == 0x14) {
    pcStack_10 = "secp224k1";
  }
  else if (in == 0x15) {
    pcStack_10 = "secp224r1";
  }
  else if (in == 0x16) {
    pcStack_10 = "secp256k1";
  }
  else if (in == 0x17) {
    pcStack_10 = "secp256r1";
  }
  else if (in == 0x18) {
    pcStack_10 = "secp384r1";
  }
  else if (in == 0x19) {
    pcStack_10 = "secp521r1";
  }
  else if (in == 0x1a) {
    pcStack_10 = "bp256r1";
  }
  else if (in == 0x1b) {
    pcStack_10 = "bp384r1";
  }
  else if (in == 0x1c) {
    pcStack_10 = "bp512r1";
  }
  else if (in == 0x1d) {
    pcStack_10 = "x25519";
  }
  else if (in == 0x1e) {
    pcStack_10 = "x448";
  }
  else if (in == 0x100) {
    pcStack_10 = "ffdhe2048";
  }
  else if (in == 0x101) {
    pcStack_10 = "ffdhe3072";
  }
  else if (in == 0x102) {
    pcStack_10 = "ffdhe4096";
  }
  else if (in == 0x103) {
    pcStack_10 = "ffdhe6144";
  }
  else if (in == 0x104) {
    pcStack_10 = "ffdhe8192";
  }
  else {
    pcStack_10 = "UNKOWN";
  }
  return pcStack_10;
}

Assistant:

const char *mbedtls_ssl_named_group_to_str( uint16_t in )
{
    switch( in )
    {
    case MBEDTLS_SSL_IANA_TLS_GROUP_SECP192K1:
        return "secp192k1";
    case MBEDTLS_SSL_IANA_TLS_GROUP_SECP192R1:
        return "secp192r1";
    case MBEDTLS_SSL_IANA_TLS_GROUP_SECP224K1:
        return "secp224k1";
    case MBEDTLS_SSL_IANA_TLS_GROUP_SECP224R1:
        return "secp224r1";
    case MBEDTLS_SSL_IANA_TLS_GROUP_SECP256K1:
        return "secp256k1";
    case MBEDTLS_SSL_IANA_TLS_GROUP_SECP256R1:
        return "secp256r1";
    case MBEDTLS_SSL_IANA_TLS_GROUP_SECP384R1:
        return "secp384r1";
    case MBEDTLS_SSL_IANA_TLS_GROUP_SECP521R1:
        return "secp521r1";
    case MBEDTLS_SSL_IANA_TLS_GROUP_BP256R1:
        return "bp256r1";
    case MBEDTLS_SSL_IANA_TLS_GROUP_BP384R1:
        return "bp384r1";
    case MBEDTLS_SSL_IANA_TLS_GROUP_BP512R1:
        return "bp512r1";
    case MBEDTLS_SSL_IANA_TLS_GROUP_X25519:
        return "x25519";
    case MBEDTLS_SSL_IANA_TLS_GROUP_X448:
        return "x448";
    case MBEDTLS_SSL_IANA_TLS_GROUP_FFDHE2048:
        return "ffdhe2048";
    case MBEDTLS_SSL_IANA_TLS_GROUP_FFDHE3072:
        return "ffdhe3072";
    case MBEDTLS_SSL_IANA_TLS_GROUP_FFDHE4096:
        return "ffdhe4096";
    case MBEDTLS_SSL_IANA_TLS_GROUP_FFDHE6144:
        return "ffdhe6144";
    case MBEDTLS_SSL_IANA_TLS_GROUP_FFDHE8192:
        return "ffdhe8192";
    };

    return "UNKOWN";
}